

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcUnroll.c
# Opt level: O2

void Unr_ManProfileRanks(Vec_Int_t *vRanks)

{
  uint uVar1;
  uint uVar2;
  Vec_Int_t *p;
  long lVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  
  if ((long)vRanks->nSize == 0) {
    iVar4 = 1;
  }
  else {
    iVar4 = *vRanks->pArray;
    for (lVar3 = 1; lVar3 < vRanks->nSize; lVar3 = lVar3 + 1) {
      iVar5 = vRanks->pArray[lVar3];
      if (iVar4 <= iVar5) {
        iVar4 = iVar5;
      }
    }
    iVar4 = iVar4 + 1;
  }
  p = Vec_IntStart(iVar4);
  iVar4 = 0;
  while( true ) {
    if (vRanks->nSize <= iVar4) {
      uVar6 = 0;
      iVar4 = p->nSize;
      if (p->nSize < 1) {
        iVar4 = 0;
      }
      uVar1 = 0;
      while (iVar5 = (int)uVar6, iVar4 != iVar5) {
        uVar2 = Vec_IntEntry(p,iVar5);
        if (uVar2 != 0) {
          printf("%2d : %8d  (%6.2f %%)\n",((double)(int)uVar2 * 100.0) / (double)vRanks->nSize,
                 uVar6,(ulong)uVar2);
          uVar1 = uVar1 + uVar2 * iVar5;
        }
        uVar6 = (ulong)(iVar5 + 1);
      }
      printf("Extra space = %d (%6.2f %%)  ",((double)(int)uVar1 * 100.0) / (double)vRanks->nSize,
             (ulong)uVar1);
      Vec_IntFree(p);
      return;
    }
    uVar1 = Vec_IntEntry(vRanks,iVar4);
    if (((int)uVar1 < 0) || (p->nSize <= (int)uVar1)) break;
    p->pArray[uVar1] = p->pArray[uVar1] + 1;
    iVar4 = iVar4 + 1;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
}

Assistant:

void Unr_ManProfileRanks( Vec_Int_t * vRanks )
{
    int RankMax = Vec_IntFindMax( vRanks );
    Vec_Int_t * vCounts = Vec_IntStart( RankMax+1 );
    int i, Rank, Count, nExtras = 0;
    Vec_IntForEachEntry( vRanks, Rank, i )
        Vec_IntAddToEntry( vCounts, Rank, 1 );
    Vec_IntForEachEntry( vCounts, Count, i )
    {
        if ( Count == 0 )
            continue;
        printf( "%2d : %8d  (%6.2f %%)\n", i, Count, 100.0 * Count / Vec_IntSize(vRanks) );
        nExtras += Count * i;
    }
    printf( "Extra space = %d (%6.2f %%)  ", nExtras, 100.0 * nExtras / Vec_IntSize(vRanks) );
    Vec_IntFree( vCounts );
}